

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void flatview_add_to_dispatch_mips
               (uc_struct_conflict4 *uc,FlatView *fv,MemoryRegionSection *section)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint16_t leaf;
  MemoryRegionSection *extraout_RDX;
  uint64_t r_1;
  FlatRange *pFVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t r;
  ulong uVar8;
  bool bVar9;
  MemoryRegionSection remain;
  MemoryRegionSection now;
  undefined1 local_c8 [24];
  MemoryRegionSection *pMStack_b0;
  MemoryRegion *local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uc_struct_conflict4 *local_88;
  AddressSpaceDispatch *local_80;
  undefined1 local_78 [24];
  MemoryRegionSection *pMStack_60;
  MemoryRegion *local_58;
  hwaddr hStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_c8._0_8_ = (undefined8)section->size;
  local_c8._8_8_ = *(long *)((long)&section->size + 8);
  local_c8._16_8_ = section->mr;
  pMStack_b0 = (MemoryRegionSection *)section->fv;
  local_a8 = (MemoryRegion *)section->offset_within_region;
  uVar2 = section->offset_within_address_space;
  local_98 = *(undefined8 *)&section->readonly;
  uStack_90 = *(undefined8 *)&section->field_0x38;
  uStack_a0 = uVar2;
  if ((uVar2 & 0xfff) != 0) {
    uVar8 = (uVar2 + 0xfff & 0xfffffffffffff000) - uVar2;
    uVar7 = (ulong)section->size;
    pFVar5 = *(FlatRange **)((long)&section->size + 8);
    local_78._16_8_ = section->mr;
    pMStack_60 = (MemoryRegionSection *)section->fv;
    local_58 = (MemoryRegion *)section->offset_within_region;
    hStack_50 = section->offset_within_address_space;
    local_48 = *(undefined8 *)&section->readonly;
    uStack_40 = *(undefined8 *)&section->field_0x38;
    uVar6 = (ulong)(uVar8 < uVar7);
    lVar1 = -(long)pFVar5;
    if (lVar1 < (long)uVar6) {
      pFVar5 = (FlatRange *)0x0;
      uVar7 = uVar8;
    }
    local_78._0_8_ = uVar7;
    local_78._8_8_ = pFVar5;
    register_subpage((uc_struct_conflict4 *)fv,(FlatView *)local_78,
                     (MemoryRegionSection *)(lVar1 - uVar6));
    section = (MemoryRegionSection *)(local_c8._0_8_ ^ uVar7);
    if ((FlatRange *)local_c8._8_8_ == pFVar5 && section == (MemoryRegionSection *)0x0) {
      return;
    }
    bVar9 = (ulong)local_c8._0_8_ < uVar7;
    local_c8._0_8_ = local_c8._0_8_ - uVar7;
    local_c8._8_8_ = local_c8._8_8_ + (-(ulong)bVar9 - (long)pFVar5);
    if (pFVar5 != (FlatRange *)0x0) goto LAB_00711813;
    uStack_a0 = uVar2 + uVar7;
    local_a8 = (MemoryRegion *)(&local_a8->ram + uVar7);
  }
  uVar2 = uStack_a0;
  uVar4 = local_c8._8_8_;
  uVar3 = local_c8._0_8_;
  if ((long)local_c8._8_8_ < (long)(ulong)((ulong)local_c8._0_8_ < 0x1000)) {
LAB_007117f6:
    register_subpage((uc_struct_conflict4 *)fv,(FlatView *)local_c8,section);
    return;
  }
  local_78._8_8_ = local_c8._8_8_;
  local_48 = local_98;
  uStack_40 = uStack_90;
  local_58 = local_a8;
  hStack_50 = uStack_a0;
  local_78._16_8_ = local_c8._16_8_;
  pMStack_60 = pMStack_b0;
  uVar6 = local_c8._0_8_ & 0xfffffffffffff000;
  local_80 = fv->dispatch;
  local_88 = (uc_struct_conflict4 *)fv;
  local_78._0_8_ = uVar6;
  leaf = phys_section_add((uc_struct_conflict4 *)&local_80->map,(PhysPageMap *)local_78,section);
  if ((long)uVar4 >> 0xc == 0) {
    uVar7 = (ulong)uVar3 >> 0xc | uVar4 << 0x34;
    if (uVar7 == 0) {
      __assert_fail("num_pages",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x38d,
                    "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)"
                   );
    }
    phys_page_set(local_80,uVar2 >> 0xc,uVar7,leaf);
    if (uVar3 == uVar6) {
      return;
    }
    local_c8._0_8_ = uVar3 - uVar6;
    local_c8._8_8_ = -(ulong)((ulong)uVar3 < uVar6);
    if ((FlatRange *)uVar4 == (FlatRange *)0x0) {
      uStack_a0 = uStack_a0 + uVar6;
      local_a8 = (MemoryRegion *)(&local_a8->ram + uVar6);
      section = extraout_RDX;
      fv = (FlatView *)local_88;
      goto LAB_007117f6;
    }
  }
LAB_00711813:
  __assert_fail("r == a",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                ,0x16,"uint64_t int128_get64(Int128)");
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}